

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench_sqlite3.cc
# Opt level: O3

void __thiscall leveldb::Benchmark::Open(Benchmark *this)

{
  bool bVar1;
  int iVar2;
  Env *pEVar3;
  undefined4 extraout_var;
  long lVar4;
  bool bVar5;
  undefined1 *puVar6;
  string *psVar7;
  undefined1 auVar8 [16];
  char *err_msg;
  string locking_stmt;
  string create_stmt;
  string tmp_dir;
  string stmt_array [2];
  char cache_size [100];
  char file_name [100];
  undefined1 local_1e8 [8];
  undefined1 *local_1e0;
  long local_1d8;
  undefined1 local_1d0 [16];
  undefined1 *local_1c0;
  _Alloc_hider local_1b8;
  undefined1 local_1b0 [16];
  undefined8 local_1a0;
  double local_198;
  undefined1 local_190 [16];
  void *local_180;
  undefined1 *local_178 [2];
  undefined1 local_168 [16];
  undefined1 *local_158 [2];
  undefined1 local_148 [64];
  char local_108 [112];
  char local_98 [104];
  
  puVar6 = local_1e8;
  if (this->db_ != (sqlite3 *)0x0) goto LAB_00106935;
  local_1e8 = (undefined1  [8])0x0;
  this->db_num_ = this->db_num_ + 1;
  local_1a0 = local_190;
  local_198 = 0.0;
  local_190[0] = 0;
  pEVar3 = Env::Default();
  (*pEVar3->_vptr_Env[0x13])(&local_180,pEVar3,&local_1a0);
  if (local_180 != (void *)0x0) {
    operator_delete__(local_180);
  }
  snprintf(local_98,100,"%s/dbbench_sqlite3-%d.db",local_1a0,(ulong)(uint)this->db_num_);
  iVar2 = sqlite3_open(local_98,this);
  if (iVar2 == 0) {
    snprintf(local_108,100,"PRAGMA cache_size = %d",(ulong)(uint)FLAGS_num_pages);
    iVar2 = sqlite3_exec(this->db_,local_108,0,0,local_1e8);
    if (iVar2 != 0) goto LAB_0010695c;
    if (FLAGS_page_size != 0x400) {
      snprintf((char *)local_178,100,"PRAGMA page_size = %d");
      iVar2 = sqlite3_exec(this->db_,local_178,0,0,local_1e8);
      if (iVar2 == 0) goto LAB_00106741;
      goto LAB_00106964;
    }
LAB_00106741:
    if (FLAGS_WAL_enabled != true) {
LAB_001067ea:
      local_1e0 = local_1d0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e0,"PRAGMA locking_mode = EXCLUSIVE","");
      local_1c0 = local_1b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1c0,"CREATE TABLE test (key blob, value blob, PRIMARY KEY(key))",
                 "");
      if (FLAGS_use_rowids == false) {
        std::__cxx11::string::append((char *)&local_1c0);
      }
      local_178[0] = local_168;
      std::__cxx11::string::_M_construct<char*>((string *)local_178,local_1e0,local_1e0 + local_1d8)
      ;
      local_158[0] = local_148;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_158,local_1c0,local_1b8._M_p + (long)local_1c0);
      psVar7 = (string *)local_178;
      bVar5 = true;
      while( true ) {
        iVar2 = sqlite3_exec(this->db_,*(undefined8 *)psVar7,0,0,local_1e8);
        if (iVar2 != 0) break;
        bVar1 = !bVar5;
        psVar7 = (string *)local_158;
        bVar5 = false;
        if (bVar1) {
          lVar4 = 0;
          do {
            if (local_148 + lVar4 != *(undefined1 **)((long)local_158 + lVar4)) {
              operator_delete(*(undefined1 **)((long)local_158 + lVar4));
            }
            lVar4 = lVar4 + -0x20;
          } while (lVar4 != -0x40);
          if (local_1c0 != local_1b0) {
            operator_delete(local_1c0);
          }
          if (local_1e0 != local_1d0) {
            operator_delete(local_1e0);
          }
          if ((undefined1 *)local_1a0 != local_190) {
            operator_delete((void *)local_1a0);
          }
          return;
        }
      }
      Open((Benchmark *)local_1e8);
LAB_00106935:
      __assert_fail("db_ == nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/benchmarks/db_bench_sqlite3.cc"
                    ,0x1a6,"void leveldb::Benchmark::Open()");
    }
    local_178[0] = local_168;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_178,"PRAGMA journal_mode = WAL","");
    local_1e0 = local_1d0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e0,"PRAGMA wal_autocheckpoint = 4096","");
    iVar2 = sqlite3_exec(this->db_,local_178[0],0,0,local_1e8);
    if (iVar2 == 0) {
      iVar2 = sqlite3_exec(this->db_,local_1e0,0,0,local_1e8);
      if (iVar2 != 0) goto LAB_00106974;
      if (local_1e0 != local_1d0) {
        operator_delete(local_1e0);
      }
      if (local_178[0] != local_168) {
        operator_delete(local_178[0]);
      }
      goto LAB_001067ea;
    }
  }
  else {
    Open(this);
LAB_0010695c:
    Open((Benchmark *)local_1e8);
LAB_00106964:
    Open((Benchmark *)local_1e8);
  }
  Open((Benchmark *)local_1e8);
LAB_00106974:
  Open((Benchmark *)local_1e8);
  pEVar3 = Env::Default();
  iVar2 = (*pEVar3->_vptr_Env[0x15])(pEVar3);
  auVar8._4_4_ = extraout_var;
  auVar8._0_4_ = iVar2;
  auVar8._8_4_ = extraout_var;
  auVar8._12_4_ = 0x45300000;
  *(double *)(puVar6 + 0x18) =
       ((auVar8._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0)) * 1e-06;
  *(undefined8 *)(puVar6 + 0x28) = 0;
  *(undefined8 *)(puVar6 + 0x38) = 0;
  **(undefined1 **)(puVar6 + 0x30) = 0;
  *(undefined8 *)(puVar6 + 0x20) = *(undefined8 *)(puVar6 + 0x18);
  Histogram::Clear((Histogram *)(puVar6 + 0x50));
  *(undefined8 *)(puVar6 + 0x574) = 0x6400000000;
  return;
}

Assistant:

void Open() {
    assert(db_ == nullptr);

    int status;
    char file_name[100];
    char* err_msg = nullptr;
    db_num_++;

    // Open database
    std::string tmp_dir;
    Env::Default()->GetTestDirectory(&tmp_dir);
    std::snprintf(file_name, sizeof(file_name), "%s/dbbench_sqlite3-%d.db",
                  tmp_dir.c_str(), db_num_);
    status = sqlite3_open(file_name, &db_);
    if (status) {
      std::fprintf(stderr, "open error: %s\n", sqlite3_errmsg(db_));
      std::exit(1);
    }

    // Change SQLite cache size
    char cache_size[100];
    std::snprintf(cache_size, sizeof(cache_size), "PRAGMA cache_size = %d",
                  FLAGS_num_pages);
    status = sqlite3_exec(db_, cache_size, nullptr, nullptr, &err_msg);
    ExecErrorCheck(status, err_msg);

    // FLAGS_page_size is defaulted to 1024
    if (FLAGS_page_size != 1024) {
      char page_size[100];
      std::snprintf(page_size, sizeof(page_size), "PRAGMA page_size = %d",
                    FLAGS_page_size);
      status = sqlite3_exec(db_, page_size, nullptr, nullptr, &err_msg);
      ExecErrorCheck(status, err_msg);
    }

    // Change journal mode to WAL if WAL enabled flag is on
    if (FLAGS_WAL_enabled) {
      std::string WAL_stmt = "PRAGMA journal_mode = WAL";

      // LevelDB's default cache size is a combined 4 MB
      std::string WAL_checkpoint = "PRAGMA wal_autocheckpoint = 4096";
      status = sqlite3_exec(db_, WAL_stmt.c_str(), nullptr, nullptr, &err_msg);
      ExecErrorCheck(status, err_msg);
      status =
          sqlite3_exec(db_, WAL_checkpoint.c_str(), nullptr, nullptr, &err_msg);
      ExecErrorCheck(status, err_msg);
    }

    // Change locking mode to exclusive and create tables/index for database
    std::string locking_stmt = "PRAGMA locking_mode = EXCLUSIVE";
    std::string create_stmt =
        "CREATE TABLE test (key blob, value blob, PRIMARY KEY(key))";
    if (!FLAGS_use_rowids) create_stmt += " WITHOUT ROWID";
    std::string stmt_array[] = {locking_stmt, create_stmt};
    int stmt_array_length = sizeof(stmt_array) / sizeof(std::string);
    for (int i = 0; i < stmt_array_length; i++) {
      status =
          sqlite3_exec(db_, stmt_array[i].c_str(), nullptr, nullptr, &err_msg);
      ExecErrorCheck(status, err_msg);
    }
  }